

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar11;
  uint uVar12;
  undefined4 uVar13;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar100;
  undefined1 auVar99 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  vbool<4> valid;
  undefined1 local_1228 [16];
  undefined1 (*local_1218) [16];
  long local_1210;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1078;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar14;
  
  pSVar21 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1098._4_4_ = uVar13;
  local_1098._0_4_ = uVar13;
  local_1098._8_4_ = uVar13;
  local_1098._12_4_ = uVar13;
  auVar80 = ZEXT1664(local_1098);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10a8._4_4_ = uVar13;
  local_10a8._0_4_ = uVar13;
  local_10a8._8_4_ = uVar13;
  local_10a8._12_4_ = uVar13;
  auVar81 = ZEXT1664(local_10a8);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10b8._4_4_ = uVar13;
  local_10b8._0_4_ = uVar13;
  local_10b8._8_4_ = uVar13;
  local_10b8._12_4_ = uVar13;
  auVar84 = ZEXT1664(local_10b8);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar109 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar85 = fVar98 * 0.99999964;
  fVar92 = fVar101 * 0.99999964;
  fVar96 = fVar109 * 0.99999964;
  fVar98 = fVar98 * 1.0000004;
  fVar101 = fVar101 * 1.0000004;
  fVar109 = fVar109 * 1.0000004;
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  auVar69._4_4_ = iVar1;
  auVar69._0_4_ = iVar1;
  auVar69._8_4_ = iVar1;
  auVar69._12_4_ = iVar1;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar33 = ZEXT1664(CONCAT412(iVar1,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))));
  local_1218 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_10c8 = fVar85;
  fStack_10c4 = fVar85;
  fStack_10c0 = fVar85;
  fStack_10bc = fVar85;
  local_10d8 = fVar92;
  fStack_10d4 = fVar92;
  fStack_10d0 = fVar92;
  fStack_10cc = fVar92;
  local_10e8 = fVar96;
  fStack_10e4 = fVar96;
  fStack_10e0 = fVar96;
  fStack_10dc = fVar96;
  local_10f8 = fVar98;
  fStack_10f4 = fVar98;
  fStack_10f0 = fVar98;
  fStack_10ec = fVar98;
  local_1108 = fVar101;
  fStack_1104 = fVar101;
  fStack_1100 = fVar101;
  fStack_10fc = fVar101;
  local_1118 = fVar109;
  fStack_1114 = fVar109;
  fStack_1110 = fVar109;
  fStack_110c = fVar109;
  fVar89 = fVar85;
  fVar90 = fVar85;
  fVar91 = fVar85;
  fVar93 = fVar92;
  fVar94 = fVar92;
  fVar95 = fVar92;
  fVar97 = fVar96;
  fVar102 = fVar96;
  fVar104 = fVar96;
  fVar106 = fVar98;
  fVar108 = fVar98;
  fVar100 = fVar98;
  fVar103 = fVar101;
  fVar105 = fVar101;
  fVar107 = fVar101;
  fVar111 = fVar109;
  fVar112 = fVar109;
  fVar113 = fVar109;
LAB_0156efd0:
  do {
    do {
      if (pSVar21 == stack) {
        return;
      }
      pSVar11 = pSVar21 + -1;
      pSVar21 = pSVar21 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar11->dist);
    uVar23 = (pSVar21->ptr).ptr;
    while ((uVar23 & 8) == 0) {
      auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar20),auVar80._0_16_);
      auVar34._0_4_ = fVar85 * auVar35._0_4_;
      auVar34._4_4_ = fVar89 * auVar35._4_4_;
      auVar34._8_4_ = fVar90 * auVar35._8_4_;
      auVar34._12_4_ = fVar91 * auVar35._12_4_;
      auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar19),auVar81._0_16_);
      auVar43._0_4_ = fVar92 * auVar35._0_4_;
      auVar43._4_4_ = fVar93 * auVar35._4_4_;
      auVar43._8_4_ = fVar94 * auVar35._8_4_;
      auVar43._12_4_ = fVar95 * auVar35._12_4_;
      auVar35 = vmaxps_avx(auVar34,auVar43);
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar17),auVar84._0_16_);
      auVar44._0_4_ = fVar96 * auVar34._0_4_;
      auVar44._4_4_ = fVar97 * auVar34._4_4_;
      auVar44._8_4_ = fVar102 * auVar34._8_4_;
      auVar44._12_4_ = fVar104 * auVar34._12_4_;
      auVar34 = vmaxps_avx(auVar44,auVar69);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar35,auVar34);
      auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar20 ^ 0x10)),auVar80._0_16_);
      auVar45._0_4_ = fVar98 * auVar35._0_4_;
      auVar45._4_4_ = fVar106 * auVar35._4_4_;
      auVar45._8_4_ = fVar108 * auVar35._8_4_;
      auVar45._12_4_ = fVar100 * auVar35._12_4_;
      auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar19 ^ 0x10)),auVar81._0_16_);
      auVar53._0_4_ = fVar101 * auVar35._0_4_;
      auVar53._4_4_ = fVar103 * auVar35._4_4_;
      auVar53._8_4_ = fVar105 * auVar35._8_4_;
      auVar53._12_4_ = fVar107 * auVar35._12_4_;
      auVar35 = vminps_avx(auVar45,auVar53);
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar17 ^ 0x10)),auVar84._0_16_);
      auVar54._0_4_ = fVar109 * auVar34._0_4_;
      auVar54._4_4_ = fVar111 * auVar34._4_4_;
      auVar54._8_4_ = fVar112 * auVar34._8_4_;
      auVar54._12_4_ = fVar113 * auVar34._12_4_;
      auVar34 = vminps_avx(auVar54,auVar33._0_16_);
      auVar35 = vminps_avx(auVar35,auVar34);
      auVar35 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar35,2);
      uVar12 = vmovmskps_avx(auVar35);
      if (uVar12 == 0) goto LAB_0156efd0;
      uVar12 = uVar12 & 0xff;
      uVar22 = uVar23 & 0xfffffffffffffff0;
      lVar18 = 0;
      for (uVar23 = (ulong)uVar12; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar23 = *(ulong *)(uVar22 + lVar18 * 8);
      uVar12 = uVar12 - 1 & uVar12;
      uVar14 = (ulong)uVar12;
      if (uVar12 != 0) {
        uVar3 = tNear.field_0.i[lVar18];
        lVar18 = 0;
        for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        uVar12 = uVar12 - 1 & uVar12;
        uVar15 = (ulong)uVar12;
        uVar14 = *(ulong *)(uVar22 + lVar18 * 8);
        uVar4 = tNear.field_0.i[lVar18];
        if (uVar12 == 0) {
          if (uVar3 < uVar4) {
            (pSVar21->ptr).ptr = uVar14;
            pSVar21->dist = uVar4;
            pSVar21 = pSVar21 + 1;
          }
          else {
            (pSVar21->ptr).ptr = uVar23;
            pSVar21->dist = uVar3;
            pSVar21 = pSVar21 + 1;
            uVar23 = uVar14;
          }
        }
        else {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar23;
          auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar3));
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar14;
          auVar34 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar4));
          lVar18 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar12 = uVar12 - 1 & uVar12;
          uVar23 = (ulong)uVar12;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(uVar22 + lVar18 * 8);
          auVar44 = vpunpcklqdq_avx(auVar55,ZEXT416((uint)tNear.field_0.i[lVar18]));
          auVar43 = vpcmpgtd_avx(auVar34,auVar35);
          if (uVar12 == 0) {
            auVar45 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar34,auVar35,auVar45);
            auVar35 = vblendvps_avx(auVar35,auVar34,auVar45);
            auVar34 = vpcmpgtd_avx(auVar44,auVar43);
            auVar45 = vpshufd_avx(auVar34,0xaa);
            auVar34 = vblendvps_avx(auVar44,auVar43,auVar45);
            auVar43 = vblendvps_avx(auVar43,auVar44,auVar45);
            auVar44 = vpcmpgtd_avx(auVar43,auVar35);
            auVar44 = vpshufd_avx(auVar44,0xaa);
            SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar43,auVar35,auVar44);
            SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar35,auVar43,auVar44);
            *pSVar21 = SVar9;
            pSVar21[1] = SVar8;
            uVar23 = auVar34._0_8_;
            pSVar21 = pSVar21 + 2;
          }
          else {
            lVar18 = 0;
            for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            auVar65._8_8_ = 0;
            auVar65._0_8_ = *(ulong *)(uVar22 + lVar18 * 8);
            auVar53 = vpunpcklqdq_avx(auVar65,ZEXT416((uint)tNear.field_0.i[lVar18]));
            auVar45 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar34,auVar35,auVar45);
            auVar35 = vblendvps_avx(auVar35,auVar34,auVar45);
            auVar34 = vpcmpgtd_avx(auVar53,auVar44);
            auVar45 = vpshufd_avx(auVar34,0xaa);
            auVar34 = vblendvps_avx(auVar53,auVar44,auVar45);
            auVar44 = vblendvps_avx(auVar44,auVar53,auVar45);
            auVar45 = vpcmpgtd_avx(auVar44,auVar35);
            auVar53 = vpshufd_avx(auVar45,0xaa);
            auVar45 = vblendvps_avx(auVar44,auVar35,auVar53);
            SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar35,auVar44,auVar53);
            auVar35 = vpcmpgtd_avx(auVar34,auVar43);
            auVar44 = vpshufd_avx(auVar35,0xaa);
            auVar35 = vblendvps_avx(auVar34,auVar43,auVar44);
            auVar34 = vblendvps_avx(auVar43,auVar34,auVar44);
            auVar43 = vpcmpgtd_avx(auVar45,auVar34);
            auVar43 = vpshufd_avx(auVar43,0xaa);
            SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar34,auVar43);
            SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar34,auVar45,auVar43);
            *pSVar21 = SVar8;
            pSVar21[1] = SVar10;
            pSVar21[2] = SVar9;
            uVar23 = auVar35._0_8_;
            pSVar21 = pSVar21 + 3;
          }
        }
      }
    }
    local_1210 = (ulong)((uint)uVar23 & 0xf) - 8;
    uVar23 = uVar23 & 0xfffffffffffffff0;
    for (lVar18 = 0; lVar18 != local_1210; lVar18 = lVar18 + 1) {
      lVar16 = lVar18 * 0xb0;
      uVar13 = *(undefined4 *)(ray + k * 4);
      auVar24._4_4_ = uVar13;
      auVar24._0_4_ = uVar13;
      auVar24._8_4_ = uVar13;
      auVar24._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar47._4_4_ = uVar13;
      auVar47._0_4_ = uVar13;
      auVar47._8_4_ = uVar13;
      auVar47._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar56._4_4_ = uVar13;
      auVar56._0_4_ = uVar13;
      auVar56._8_4_ = uVar13;
      auVar56._12_4_ = uVar13;
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + lVar16),auVar24);
      auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x10 + lVar16),auVar47);
      auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x20 + lVar16),auVar56);
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x30 + lVar16),auVar24);
      auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x40 + lVar16),auVar47);
      auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x50 + lVar16),auVar56);
      auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x60 + lVar16),auVar24);
      auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x70 + lVar16),auVar47);
      auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar23 + 0x80 + lVar16),auVar56);
      local_1018 = vsubps_avx(auVar54,auVar43);
      local_1038 = vsubps_avx(auVar46,auVar44);
      local_1028 = vsubps_avx(auVar55,auVar35);
      auVar25._0_4_ = auVar43._0_4_ + auVar54._0_4_;
      auVar25._4_4_ = auVar43._4_4_ + auVar54._4_4_;
      auVar25._8_4_ = auVar43._8_4_ + auVar54._8_4_;
      auVar25._12_4_ = auVar43._12_4_ + auVar54._12_4_;
      auVar57._0_4_ = auVar44._0_4_ + auVar46._0_4_;
      auVar57._4_4_ = auVar44._4_4_ + auVar46._4_4_;
      auVar57._8_4_ = auVar44._8_4_ + auVar46._8_4_;
      auVar57._12_4_ = auVar44._12_4_ + auVar46._12_4_;
      fVar102 = auVar35._0_4_;
      auVar60._0_4_ = fVar102 + auVar55._0_4_;
      fVar104 = auVar35._4_4_;
      auVar60._4_4_ = fVar104 + auVar55._4_4_;
      fVar106 = auVar35._8_4_;
      auVar60._8_4_ = fVar106 + auVar55._8_4_;
      fVar108 = auVar35._12_4_;
      auVar60._12_4_ = fVar108 + auVar55._12_4_;
      auVar99._0_4_ = local_1028._0_4_ * auVar57._0_4_;
      auVar99._4_4_ = local_1028._4_4_ * auVar57._4_4_;
      auVar99._8_4_ = local_1028._8_4_ * auVar57._8_4_;
      auVar99._12_4_ = local_1028._12_4_ * auVar57._12_4_;
      auVar24 = vfmsub231ps_fma(auVar99,local_1038,auVar60);
      auVar61._0_4_ = auVar60._0_4_ * local_1018._0_4_;
      auVar61._4_4_ = auVar60._4_4_ * local_1018._4_4_;
      auVar61._8_4_ = auVar60._8_4_ * local_1018._8_4_;
      auVar61._12_4_ = auVar60._12_4_ * local_1018._12_4_;
      auVar65 = vfmsub231ps_fma(auVar61,local_1028,auVar25);
      auVar26._0_4_ = local_1038._0_4_ * auVar25._0_4_;
      auVar26._4_4_ = local_1038._4_4_ * auVar25._4_4_;
      auVar26._8_4_ = local_1038._8_4_ * auVar25._8_4_;
      auVar26._12_4_ = local_1038._12_4_ * auVar25._12_4_;
      auVar25 = vfmsub231ps_fma(auVar26,local_1018,auVar57);
      fVar98 = *(float *)(ray + k * 4 + 0x60);
      auVar58._0_4_ = fVar98 * auVar25._0_4_;
      auVar58._4_4_ = fVar98 * auVar25._4_4_;
      auVar58._8_4_ = fVar98 * auVar25._8_4_;
      auVar58._12_4_ = fVar98 * auVar25._12_4_;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar82._4_4_ = uVar13;
      auVar82._0_4_ = uVar13;
      auVar82._8_4_ = uVar13;
      auVar82._12_4_ = uVar13;
      auVar65 = vfmadd231ps_fma(auVar58,auVar82,auVar65);
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar110._4_4_ = uVar13;
      auVar110._0_4_ = uVar13;
      auVar110._8_4_ = uVar13;
      auVar110._12_4_ = uVar13;
      local_1078 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar65,auVar110,auVar24);
      local_1048 = vsubps_avx(auVar44,auVar45);
      local_1058 = vsubps_avx(auVar35,auVar53);
      auVar66._0_4_ = auVar45._0_4_ + auVar44._0_4_;
      auVar66._4_4_ = auVar45._4_4_ + auVar44._4_4_;
      auVar66._8_4_ = auVar45._8_4_ + auVar44._8_4_;
      auVar66._12_4_ = auVar45._12_4_ + auVar44._12_4_;
      auVar62._0_4_ = fVar102 + auVar53._0_4_;
      auVar62._4_4_ = fVar104 + auVar53._4_4_;
      auVar62._8_4_ = fVar106 + auVar53._8_4_;
      auVar62._12_4_ = fVar108 + auVar53._12_4_;
      fVar101 = local_1058._0_4_;
      auVar70._0_4_ = auVar66._0_4_ * fVar101;
      fVar92 = local_1058._4_4_;
      auVar70._4_4_ = auVar66._4_4_ * fVar92;
      fVar90 = local_1058._8_4_;
      auVar70._8_4_ = auVar66._8_4_ * fVar90;
      fVar94 = local_1058._12_4_;
      auVar70._12_4_ = auVar66._12_4_ * fVar94;
      auVar65 = vfmsub231ps_fma(auVar70,local_1048,auVar62);
      local_1068 = vsubps_avx(auVar43,auVar34);
      fVar109 = local_1068._0_4_;
      auVar76._0_4_ = auVar62._0_4_ * fVar109;
      fVar96 = local_1068._4_4_;
      auVar76._4_4_ = auVar62._4_4_ * fVar96;
      fVar91 = local_1068._8_4_;
      auVar76._8_4_ = auVar62._8_4_ * fVar91;
      fVar95 = local_1068._12_4_;
      auVar76._12_4_ = auVar62._12_4_ * fVar95;
      auVar63._0_4_ = auVar43._0_4_ + auVar34._0_4_;
      auVar63._4_4_ = auVar43._4_4_ + auVar34._4_4_;
      auVar63._8_4_ = auVar43._8_4_ + auVar34._8_4_;
      auVar63._12_4_ = auVar43._12_4_ + auVar34._12_4_;
      auVar35 = vfmsub231ps_fma(auVar76,local_1058,auVar63);
      fVar85 = local_1048._0_4_;
      auVar64._0_4_ = auVar63._0_4_ * fVar85;
      fVar89 = local_1048._4_4_;
      auVar64._4_4_ = auVar63._4_4_ * fVar89;
      fVar93 = local_1048._8_4_;
      auVar64._8_4_ = auVar63._8_4_ * fVar93;
      fVar97 = local_1048._12_4_;
      auVar64._12_4_ = auVar63._12_4_ * fVar97;
      auVar24 = vfmsub231ps_fma(auVar64,local_1068,auVar66);
      auVar27._0_4_ = fVar98 * auVar24._0_4_;
      auVar27._4_4_ = fVar98 * auVar24._4_4_;
      auVar27._8_4_ = fVar98 * auVar24._8_4_;
      auVar27._12_4_ = fVar98 * auVar24._12_4_;
      auVar35 = vfmadd231ps_fma(auVar27,auVar82,auVar35);
      auVar24 = vfmadd231ps_fma(auVar35,auVar110,auVar65);
      auVar65 = vsubps_avx(auVar34,auVar54);
      auVar71._0_4_ = auVar34._0_4_ + auVar54._0_4_;
      auVar71._4_4_ = auVar34._4_4_ + auVar54._4_4_;
      auVar71._8_4_ = auVar34._8_4_ + auVar54._8_4_;
      auVar71._12_4_ = auVar34._12_4_ + auVar54._12_4_;
      auVar54 = vsubps_avx(auVar45,auVar46);
      auVar48._0_4_ = auVar45._0_4_ + auVar46._0_4_;
      auVar48._4_4_ = auVar45._4_4_ + auVar46._4_4_;
      auVar48._8_4_ = auVar45._8_4_ + auVar46._8_4_;
      auVar48._12_4_ = auVar45._12_4_ + auVar46._12_4_;
      auVar45 = vsubps_avx(auVar53,auVar55);
      auVar36._0_4_ = auVar53._0_4_ + auVar55._0_4_;
      auVar36._4_4_ = auVar53._4_4_ + auVar55._4_4_;
      auVar36._8_4_ = auVar53._8_4_ + auVar55._8_4_;
      auVar36._12_4_ = auVar53._12_4_ + auVar55._12_4_;
      auVar67._0_4_ = auVar45._0_4_ * auVar48._0_4_;
      auVar67._4_4_ = auVar45._4_4_ * auVar48._4_4_;
      auVar67._8_4_ = auVar45._8_4_ * auVar48._8_4_;
      auVar67._12_4_ = auVar45._12_4_ * auVar48._12_4_;
      auVar34 = vfmsub231ps_fma(auVar67,auVar54,auVar36);
      auVar37._0_4_ = auVar36._0_4_ * auVar65._0_4_;
      auVar37._4_4_ = auVar36._4_4_ * auVar65._4_4_;
      auVar37._8_4_ = auVar36._8_4_ * auVar65._8_4_;
      auVar37._12_4_ = auVar36._12_4_ * auVar65._12_4_;
      auVar35 = vfmsub231ps_fma(auVar37,auVar45,auVar71);
      auVar72._0_4_ = auVar54._0_4_ * auVar71._0_4_;
      auVar72._4_4_ = auVar54._4_4_ * auVar71._4_4_;
      auVar72._8_4_ = auVar54._8_4_ * auVar71._8_4_;
      auVar72._12_4_ = auVar54._12_4_ * auVar71._12_4_;
      auVar53 = vfmsub231ps_fma(auVar72,auVar65,auVar48);
      auVar49._0_4_ = fVar98 * auVar53._0_4_;
      auVar49._4_4_ = fVar98 * auVar53._4_4_;
      auVar49._8_4_ = fVar98 * auVar53._8_4_;
      auVar49._12_4_ = fVar98 * auVar53._12_4_;
      auVar35 = vfmadd231ps_fma(auVar49,auVar82,auVar35);
      auVar53 = vfmadd231ps_fma(auVar35,auVar110,auVar34);
      auVar83._0_4_ = auVar53._0_4_ + auVar24._0_4_ + local_1078.v[0];
      auVar83._4_4_ = auVar53._4_4_ + auVar24._4_4_ + local_1078.v[1];
      auVar83._8_4_ = auVar53._8_4_ + auVar24._8_4_ + local_1078.v[2];
      auVar83._12_4_ = auVar53._12_4_ + auVar24._12_4_ + local_1078.v[3];
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar35 = vminps_avx((undefined1  [16])local_1078,auVar24);
      auVar35 = vminps_avx(auVar35,auVar53);
      local_1088 = vandps_avx(auVar83,auVar68);
      auVar77._0_4_ = local_1088._0_4_ * 1.1920929e-07;
      auVar77._4_4_ = local_1088._4_4_ * 1.1920929e-07;
      auVar77._8_4_ = local_1088._8_4_ * 1.1920929e-07;
      auVar77._12_4_ = local_1088._12_4_ * 1.1920929e-07;
      uVar22 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
      auVar73._0_8_ = uVar22 ^ 0x8000000080000000;
      auVar73._8_4_ = -auVar77._8_4_;
      auVar73._12_4_ = -auVar77._12_4_;
      auVar35 = vcmpps_avx(auVar35,auVar73,5);
      auVar34 = vmaxps_avx((undefined1  [16])local_1078,auVar24);
      auVar34 = vmaxps_avx(auVar34,auVar53);
      auVar34 = vcmpps_avx(auVar34,auVar77,2);
      auVar35 = vorps_avx(auVar35,auVar34);
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        auVar50._0_4_ = fVar85 * local_1028._0_4_;
        auVar50._4_4_ = fVar89 * local_1028._4_4_;
        auVar50._8_4_ = fVar93 * local_1028._8_4_;
        auVar50._12_4_ = fVar97 * local_1028._12_4_;
        auVar74._0_4_ = fVar109 * local_1038._0_4_;
        auVar74._4_4_ = fVar96 * local_1038._4_4_;
        auVar74._8_4_ = fVar91 * local_1038._8_4_;
        auVar74._12_4_ = fVar95 * local_1038._12_4_;
        auVar53 = vfmsub213ps_fma(local_1038,local_1058,auVar50);
        auVar78._0_4_ = auVar54._0_4_ * fVar101;
        auVar78._4_4_ = auVar54._4_4_ * fVar92;
        auVar78._8_4_ = auVar54._8_4_ * fVar90;
        auVar78._12_4_ = auVar54._12_4_ * fVar94;
        auVar38._0_4_ = fVar109 * auVar45._0_4_;
        auVar38._4_4_ = fVar96 * auVar45._4_4_;
        auVar38._8_4_ = fVar91 * auVar45._8_4_;
        auVar38._12_4_ = fVar95 * auVar45._12_4_;
        auVar46 = vfmsub213ps_fma(auVar45,local_1048,auVar78);
        auVar34 = vandps_avx(auVar50,auVar68);
        auVar45 = vandps_avx(auVar78,auVar68);
        auVar34 = vcmpps_avx(auVar34,auVar45,1);
        local_1148 = vblendvps_avx(auVar46,auVar53,auVar34);
        auVar79._0_4_ = fVar85 * auVar65._0_4_;
        auVar79._4_4_ = fVar89 * auVar65._4_4_;
        auVar79._8_4_ = fVar93 * auVar65._8_4_;
        auVar79._12_4_ = fVar97 * auVar65._12_4_;
        auVar53 = vfmsub213ps_fma(auVar65,local_1058,auVar38);
        auVar86._0_4_ = local_1018._0_4_ * fVar101;
        auVar86._4_4_ = local_1018._4_4_ * fVar92;
        auVar86._8_4_ = local_1018._8_4_ * fVar90;
        auVar86._12_4_ = local_1018._12_4_ * fVar94;
        auVar46 = vfmsub213ps_fma(local_1028,local_1068,auVar86);
        auVar34 = vandps_avx(auVar86,auVar68);
        auVar45 = vandps_avx(auVar38,auVar68);
        auVar34 = vcmpps_avx(auVar34,auVar45,1);
        local_1138 = vblendvps_avx(auVar53,auVar46,auVar34);
        auVar53 = vfmsub213ps_fma(local_1018,local_1048,auVar74);
        auVar54 = vfmsub213ps_fma(auVar54,local_1068,auVar79);
        auVar34 = vandps_avx(auVar74,auVar68);
        auVar45 = vandps_avx(auVar79,auVar68);
        auVar34 = vcmpps_avx(auVar34,auVar45,1);
        local_1128 = vblendvps_avx(auVar54,auVar53,auVar34);
        auVar39._0_4_ = local_1128._0_4_ * fVar98;
        auVar39._4_4_ = local_1128._4_4_ * fVar98;
        auVar39._8_4_ = local_1128._8_4_ * fVar98;
        auVar39._12_4_ = local_1128._12_4_ * fVar98;
        auVar34 = vfmadd213ps_fma(auVar82,local_1138,auVar39);
        auVar34 = vfmadd213ps_fma(auVar110,local_1148,auVar34);
        auVar75._0_4_ = auVar34._0_4_ + auVar34._0_4_;
        auVar75._4_4_ = auVar34._4_4_ + auVar34._4_4_;
        auVar75._8_4_ = auVar34._8_4_ + auVar34._8_4_;
        auVar75._12_4_ = auVar34._12_4_ + auVar34._12_4_;
        auVar40._0_4_ = local_1128._0_4_ * fVar102;
        auVar40._4_4_ = local_1128._4_4_ * fVar104;
        auVar40._8_4_ = local_1128._8_4_ * fVar106;
        auVar40._12_4_ = local_1128._12_4_ * fVar108;
        auVar34 = vfmadd213ps_fma(auVar44,local_1138,auVar40);
        auVar43 = vfmadd213ps_fma(auVar43,local_1148,auVar34);
        auVar34 = vrcpps_avx(auVar75);
        auVar87._8_4_ = 0x3f800000;
        auVar87._0_8_ = 0x3f8000003f800000;
        auVar87._12_4_ = 0x3f800000;
        auVar44 = vfnmadd213ps_fma(auVar34,auVar75,auVar87);
        auVar34 = vfmadd132ps_fma(auVar44,auVar34,auVar34);
        local_1158._0_4_ = auVar34._0_4_ * (auVar43._0_4_ + auVar43._0_4_);
        local_1158._4_4_ = auVar34._4_4_ * (auVar43._4_4_ + auVar43._4_4_);
        local_1158._8_4_ = auVar34._8_4_ * (auVar43._8_4_ + auVar43._8_4_);
        local_1158._12_4_ = auVar34._12_4_ * (auVar43._12_4_ + auVar43._12_4_);
        auVar33 = ZEXT1664(local_1158);
        uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar41._4_4_ = uVar13;
        auVar41._0_4_ = uVar13;
        auVar41._8_4_ = uVar13;
        auVar41._12_4_ = uVar13;
        auVar34 = vcmpps_avx(auVar41,local_1158,2);
        uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar88._4_4_ = uVar13;
        auVar88._0_4_ = uVar13;
        auVar88._8_4_ = uVar13;
        auVar88._12_4_ = uVar13;
        auVar80 = ZEXT1664(auVar88);
        auVar43 = vcmpps_avx(local_1158,auVar88,2);
        auVar34 = vandps_avx(auVar34,auVar43);
        auVar43 = auVar35 & auVar34;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          auVar35 = vandps_avx(auVar34,auVar35);
          auVar43 = vcmpps_avx(auVar75,_DAT_01f45a50,4);
          auVar44 = auVar43 & auVar35;
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar35,auVar43);
            tNear.field_0 = local_1078;
            pSVar5 = context->scene;
            auVar35 = vrcpps_avx(auVar83);
            auVar59._8_4_ = 0x3f800000;
            auVar59._0_8_ = 0x3f8000003f800000;
            auVar59._12_4_ = 0x3f800000;
            auVar43 = vfnmadd213ps_fma(auVar83,auVar35,auVar59);
            auVar43 = vfmadd132ps_fma(auVar43,auVar35,auVar35);
            auVar51._8_4_ = 0x219392ef;
            auVar51._0_8_ = 0x219392ef219392ef;
            auVar51._12_4_ = 0x219392ef;
            auVar35 = vcmpps_avx(local_1088,auVar51,5);
            auVar35 = vandps_avx(auVar43,auVar35);
            auVar28._0_4_ = local_1078.v[0] * auVar35._0_4_;
            auVar28._4_4_ = local_1078.v[1] * auVar35._4_4_;
            auVar28._8_4_ = local_1078.v[2] * auVar35._8_4_;
            auVar28._12_4_ = local_1078.v[3] * auVar35._12_4_;
            local_1178 = vminps_avx(auVar28,auVar59);
            auVar29._0_4_ = auVar24._0_4_ * auVar35._0_4_;
            auVar29._4_4_ = auVar24._4_4_ * auVar35._4_4_;
            auVar29._8_4_ = auVar24._8_4_ * auVar35._8_4_;
            auVar29._12_4_ = auVar24._12_4_ * auVar35._12_4_;
            local_1168 = vminps_avx(auVar29,auVar59);
            auVar52._8_4_ = 0x7f800000;
            auVar52._0_8_ = 0x7f8000007f800000;
            auVar52._12_4_ = 0x7f800000;
            auVar35 = vblendvps_avx(auVar52,local_1158,(undefined1  [16])valid.field_0);
            auVar43 = vshufps_avx(auVar35,auVar35,0xb1);
            auVar43 = vminps_avx(auVar43,auVar35);
            auVar44 = vshufpd_avx(auVar43,auVar43,1);
            auVar43 = vminps_avx(auVar44,auVar43);
            auVar35 = vcmpps_avx(auVar35,auVar43,0);
            auVar44 = (undefined1  [16])valid.field_0 & auVar35;
            auVar43 = vpcmpeqd_avx(auVar43,auVar43);
            if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar44[0xf] < '\0') {
              auVar43 = auVar35;
            }
            lVar16 = lVar16 + uVar23;
            auVar35 = vandps_avx((undefined1  [16])valid.field_0,auVar43);
            uVar13 = vmovmskps_avx(auVar35);
            uVar22 = 0;
            for (uVar14 = CONCAT44((int)((ulong)pSVar5 >> 0x20),uVar13); (uVar14 & 1) == 0;
                uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              uVar22 = uVar22 + 1;
            }
            auVar35 = vpcmpeqd_avx(auVar34,auVar34);
            auVar81 = ZEXT1664(auVar35);
            do {
              uVar12 = *(uint *)(lVar16 + 0x90 + uVar22 * 4);
              uVar14 = (ulong)uVar12;
              pGVar6 = (pSVar5->geometries).items[uVar14].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[uVar22] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar13 = *(undefined4 *)(local_1178 + uVar22 * 4);
                  uVar2 = *(undefined4 *)(local_1168 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1148 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1138 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1128 + uVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar13;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar16 + 0xa0 + uVar22 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar12;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar13 = *(undefined4 *)(local_1178 + uVar22 * 4);
                local_fd8._4_4_ = uVar13;
                local_fd8._0_4_ = uVar13;
                local_fd8._8_4_ = uVar13;
                local_fd8._12_4_ = uVar13;
                local_fc8 = *(undefined4 *)(local_1168 + uVar22 * 4);
                local_fa8._4_4_ = uVar12;
                local_fa8._0_4_ = uVar12;
                local_fa8._8_4_ = uVar12;
                local_fa8._12_4_ = uVar12;
                uVar13 = *(undefined4 *)(lVar16 + 0xa0 + uVar22 * 4);
                local_fb8._4_4_ = uVar13;
                local_fb8._0_4_ = uVar13;
                local_fb8._8_4_ = uVar13;
                local_fb8._12_4_ = uVar13;
                uVar13 = *(undefined4 *)(local_1148 + uVar22 * 4);
                uVar2 = *(undefined4 *)(local_1138 + uVar22 * 4);
                local_ff8._4_4_ = uVar2;
                local_ff8._0_4_ = uVar2;
                local_ff8._8_4_ = uVar2;
                local_ff8._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1128 + uVar22 * 4);
                local_fe8._4_4_ = uVar2;
                local_fe8._0_4_ = uVar2;
                local_fe8._8_4_ = uVar2;
                local_fe8._12_4_ = uVar2;
                local_1008[0] = (RTCHitN)(char)uVar13;
                local_1008[1] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar13;
                local_1008[5] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar13;
                local_1008[9] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar13;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                uStack_fc4 = local_fc8;
                uStack_fc0 = local_fc8;
                uStack_fbc = local_fc8;
                vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                uStack_f94 = context->user->instID[0];
                local_f98 = uStack_f94;
                uStack_f90 = uStack_f94;
                uStack_f8c = uStack_f94;
                uStack_f88 = context->user->instPrimID[0];
                uStack_f84 = uStack_f88;
                uStack_f80 = uStack_f88;
                uStack_f7c = uStack_f88;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + uVar22 * 4);
                local_1228 = *local_1218;
                args.valid = (int *)local_1228;
                args.geometryUserPtr = pGVar6->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                auVar35 = auVar33._0_16_;
                auVar34 = auVar80._0_16_;
                args.ray = (RTCRayN *)ray;
                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar43 = auVar81._0_16_;
                  (*pGVar6->intersectionFilterN)(&args);
                  auVar80 = ZEXT1664(auVar34);
                  auVar33 = ZEXT1664(auVar35);
                  auVar43 = vpcmpeqd_avx(auVar43,auVar43);
                  auVar81 = ZEXT1664(auVar43);
                }
                auVar43 = auVar81._0_16_;
                if (local_1228 == (undefined1  [16])0x0) {
                  auVar35 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar35 = auVar35 ^ auVar43;
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&args);
                    auVar80 = ZEXT1664(auVar34);
                    auVar33 = ZEXT1664(auVar35);
                    auVar35 = vpcmpeqd_avx(auVar43,auVar43);
                    auVar81 = ZEXT1664(auVar35);
                  }
                  auVar34 = vpcmpeqd_avx(local_1228,_DAT_01f45a50);
                  auVar35 = auVar34 ^ auVar81._0_16_;
                  if (local_1228 != (undefined1  [16])0x0) {
                    auVar34 = auVar34 ^ auVar81._0_16_;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])args.hit);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x10));
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x20));
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x30));
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x40));
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar43;
                    auVar34 = vmaskmovps_avx(auVar34,*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar34;
                  }
                }
                auVar31._8_8_ = 0x100000001;
                auVar31._0_8_ = 0x100000001;
                if ((auVar31 & auVar35) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar80._0_4_;
                }
                else {
                  auVar80 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[uVar22] = 0.0;
                uVar13 = auVar80._0_4_;
                auVar32._4_4_ = uVar13;
                auVar32._0_4_ = uVar13;
                auVar32._8_4_ = uVar13;
                auVar32._12_4_ = uVar13;
                auVar35 = vcmpps_avx(auVar33._0_16_,auVar32,2);
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vandps_avx(auVar35,(undefined1  [16])valid.field_0);
                uVar14 = uVar22;
              }
              if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 &&
                   ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                   (undefined1  [16])0x0) &&
                  ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) break;
              auVar42._8_4_ = 0x7f800000;
              auVar42._0_8_ = 0x7f8000007f800000;
              auVar42._12_4_ = 0x7f800000;
              auVar35 = vblendvps_avx(auVar42,auVar33._0_16_,(undefined1  [16])valid.field_0);
              auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar43 = vshufpd_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar43,auVar34);
              auVar35 = vcmpps_avx(auVar35,auVar34,0);
              auVar34 = (undefined1  [16])valid.field_0 & auVar35;
              aVar30 = valid.field_0;
              if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar34[0xf] < '\0') {
                aVar30.v = (__m128)vandps_avx(auVar35,valid.field_0);
              }
              uVar13 = vmovmskps_avx((undefined1  [16])aVar30);
              uVar22 = 0;
              for (uVar14 = CONCAT44((int)(uVar14 >> 0x20),uVar13); (uVar14 & 1) == 0;
                  uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                uVar22 = uVar22 + 1;
              }
            } while( true );
          }
        }
      }
      auVar80 = ZEXT1664(local_1098);
      auVar81 = ZEXT1664(local_10a8);
      auVar84 = ZEXT1664(local_10b8);
      fVar85 = local_10c8;
      fVar89 = fStack_10c4;
      fVar90 = fStack_10c0;
      fVar91 = fStack_10bc;
      fVar92 = local_10d8;
      fVar93 = fStack_10d4;
      fVar94 = fStack_10d0;
      fVar95 = fStack_10cc;
      fVar96 = local_10e8;
      fVar97 = fStack_10e4;
      fVar102 = fStack_10e0;
      fVar104 = fStack_10dc;
      fVar98 = local_10f8;
      fVar106 = fStack_10f4;
      fVar108 = fStack_10f0;
      fVar100 = fStack_10ec;
      fVar101 = local_1108;
      fVar103 = fStack_1104;
      fVar105 = fStack_1100;
      fVar107 = fStack_10fc;
      fVar109 = local_1118;
      fVar111 = fStack_1114;
      fVar112 = fStack_1110;
      fVar113 = fStack_110c;
    }
    uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar33 = ZEXT1664(CONCAT412(uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }